

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O1

plutovg_paint_t * plutovg_paint_create_rgba(float r,float g,float b,float a)

{
  plutovg_paint_t *ppVar1;
  float fVar2;
  
  ppVar1 = (plutovg_paint_t *)malloc(0x18);
  ppVar1->ref_count = 1;
  ppVar1->type = PLUTOVG_PAINT_TYPE_COLOR;
  fVar2 = 1.0;
  if (r <= 1.0) {
    fVar2 = r;
  }
  ppVar1[1].ref_count = ~-(uint)(r < 0.0) & (uint)fVar2;
  fVar2 = 1.0;
  if (g <= 1.0) {
    fVar2 = g;
  }
  ppVar1[1].type = ~-(uint)(g < 0.0) & (uint)fVar2;
  fVar2 = 1.0;
  if (b <= 1.0) {
    fVar2 = b;
  }
  ppVar1[2].ref_count = ~-(uint)(b < 0.0) & (uint)fVar2;
  fVar2 = 1.0;
  if (a <= 1.0) {
    fVar2 = a;
  }
  ppVar1[2].type = ~-(uint)(a < 0.0) & (uint)fVar2;
  return ppVar1;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_rgba(float r, float g, float b, float a)
{
    plutovg_solid_paint_t* solid = plutovg_paint_create(PLUTOVG_PAINT_TYPE_COLOR, sizeof(plutovg_solid_paint_t));
    solid->color.r = plutovg_clamp(r, 0.f, 1.f);
    solid->color.g = plutovg_clamp(g, 0.f, 1.f);
    solid->color.b = plutovg_clamp(b, 0.f, 1.f);
    solid->color.a = plutovg_clamp(a, 0.f, 1.f);
    return &solid->base;
}